

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_message_builder.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::java::MessageBuilderGenerator::GenerateIsInitialized
          (MessageBuilderGenerator *this,Printer *printer)

{
  int iVar1;
  long lVar2;
  ClassNameResolver *pCVar3;
  OneofDescriptor *oneof;
  Printer *this_00;
  bool bVar4;
  JavaType JVar5;
  Type TVar6;
  FieldGeneratorInfo *pFVar7;
  Descriptor *pDVar8;
  FieldDescriptor *pFVar9;
  LogMessage *pLVar10;
  ulong uVar11;
  int i_00;
  long lVar12;
  int i;
  long lVar13;
  allocator local_a1;
  Printer *local_a0;
  FieldGeneratorInfo *local_98;
  OneofGeneratorInfo *local_90;
  LogMessage local_88;
  
  io::Printer::Print(printer,"public final boolean isInitialized() {\n");
  local_a0 = printer;
  io::Printer::Indent(printer);
  lVar12 = 0;
  lVar13 = 0;
  while( true ) {
    pDVar8 = this->descriptor_;
    uVar11 = (ulong)*(int *)(pDVar8 + 0x2c);
    if ((long)uVar11 <= lVar13) break;
    lVar2 = *(long *)(pDVar8 + 0x30);
    pFVar7 = Context::GetFieldGeneratorInfo(this->context_,(FieldDescriptor *)(lVar12 + lVar2));
    if (*(int *)(lVar2 + 0x4c + lVar12) == 2) {
      io::Printer::Print(local_a0,"if (!has$name$()) {\n  return false;\n}\n","name",
                         &pFVar7->capitalized_name);
    }
    lVar13 = lVar13 + 1;
    lVar12 = lVar12 + 0xa8;
  }
  lVar13 = 0;
  lVar12 = 0;
  do {
    this_00 = local_a0;
    if ((int)uVar11 <= lVar12) {
      if (0 < *(int *)(pDVar8 + 0x68)) {
        io::Printer::Print(local_a0,"if (!extensionsAreInitialized()) {\n  return false;\n}\n");
      }
      io::Printer::Outdent(this_00);
      io::Printer::Print(this_00,"  return true;\n}\n\n");
      return;
    }
    lVar2 = *(long *)(pDVar8 + 0x30);
    pFVar9 = (FieldDescriptor *)(lVar13 + lVar2);
    local_98 = Context::GetFieldGeneratorInfo(this->context_,pFVar9);
    JVar5 = GetJavaType(pFVar9);
    if (JVar5 == JAVATYPE_MESSAGE) {
      pDVar8 = FieldDescriptor::message_type(pFVar9);
      bVar4 = HasRequiredFields(pDVar8);
      pFVar7 = local_98;
      if (bVar4) {
        iVar1 = *(int *)(lVar2 + 0x4c + lVar13);
        if (iVar1 == 1) {
          if ((*(int *)(*(long *)(this->descriptor_ + 0x10) + 0x8c) == 3) &&
             (oneof = *(OneofDescriptor **)(lVar2 + 0x60 + lVar13), oneof != (OneofDescriptor *)0x0)
             ) {
            local_90 = Context::GetOneofGeneratorInfo(this->context_,oneof);
            SimpleItoa_abi_cxx11_
                      ((string *)&local_88,(protobuf *)(ulong)*(uint *)(lVar2 + 0x38 + lVar13),i_00)
            ;
            io::Printer::Print(local_a0,"if ($oneof_name$Case_ == $field_number$) {\n","oneof_name",
                               &local_90->name,"field_number",(string *)&local_88);
            std::__cxx11::string::~string((string *)&local_88);
            pFVar7 = local_98;
          }
          else {
            io::Printer::Print(local_a0,"if (has$name$()) {\n","name",&local_98->capitalized_name);
          }
          io::Printer::Print(local_a0,
                             "  if (!get$name$().isInitialized()) {\n    return false;\n  }\n}\n",
                             "name",&pFVar7->capitalized_name);
        }
        else {
          pLVar10 = &local_88;
          if (iVar1 == 3) {
            pDVar8 = FieldDescriptor::message_type(pFVar9);
            if (*(char *)(*(long *)(pDVar8 + 0x20) + 0x6b) == '\x01') {
              pDVar8 = FieldDescriptor::message_type(pFVar9);
              local_90 = (OneofGeneratorInfo *)this->name_resolver_;
              std::__cxx11::string::string((string *)&local_88,"value",&local_a1);
              pFVar9 = Descriptor::FindFieldByName(pDVar8,(string *)&local_88);
              std::__cxx11::string::~string((string *)&local_88);
              TVar6 = FieldDescriptor::type(pFVar9);
              if (TVar6 != TYPE_MESSAGE) {
                internal::LogMessage::LogMessage
                          (&local_88,LOGLEVEL_DFATAL,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/compiler/java/java_message_builder.cc"
                           ,0x4a);
                pLVar10 = internal::LogMessage::operator<<
                                    (&local_88,
                                     "CHECK failed: (FieldDescriptor::TYPE_MESSAGE) == (value_field->type()): "
                                    );
                internal::LogFinisher::operator=((LogFinisher *)&local_a1,pLVar10);
                internal::LogMessage::~LogMessage(&local_88);
              }
              pDVar8 = FieldDescriptor::message_type(pFVar9);
              ClassNameResolver::GetImmutableClassName<google::protobuf::Descriptor>
                        ((string *)&stack0xffffffffffffffb0,(ClassNameResolver *)local_90,pDVar8);
              io::Printer::Print(local_a0,
                                 "for ($type$ item : get$name$Map().values()) {\n  if (!item.isInitialized()) {\n    return false;\n  }\n}\n"
                                 ,"type",(string *)&stack0xffffffffffffffb0,"name",
                                 &local_98->capitalized_name);
              pLVar10 = (LogMessage *)&stack0xffffffffffffffb0;
            }
            else {
              pCVar3 = this->name_resolver_;
              pDVar8 = FieldDescriptor::message_type(pFVar9);
              ClassNameResolver::GetImmutableClassName<google::protobuf::Descriptor>
                        ((string *)&local_88,pCVar3,pDVar8);
              io::Printer::Print(local_a0,
                                 "for (int i = 0; i < get$name$Count(); i++) {\n  if (!get$name$(i).isInitialized()) {\n    return false;\n  }\n}\n"
                                 ,"type",(string *)&local_88,"name",&local_98->capitalized_name);
            }
          }
          else {
            if (iVar1 != 2) goto LAB_0029231d;
            pCVar3 = this->name_resolver_;
            pDVar8 = FieldDescriptor::message_type(pFVar9);
            ClassNameResolver::GetImmutableClassName<google::protobuf::Descriptor>
                      ((string *)&local_88,pCVar3,pDVar8);
            io::Printer::Print(local_a0,"if (!get$name$().isInitialized()) {\n  return false;\n}\n",
                               "type",(string *)&local_88,"name",&local_98->capitalized_name);
          }
          std::__cxx11::string::~string((string *)pLVar10);
        }
      }
    }
LAB_0029231d:
    lVar12 = lVar12 + 1;
    pDVar8 = this->descriptor_;
    uVar11 = (ulong)*(uint *)(pDVar8 + 0x2c);
    lVar13 = lVar13 + 0xa8;
  } while( true );
}

Assistant:

void MessageBuilderGenerator::GenerateIsInitialized(
    io::Printer* printer) {
  printer->Print(
    "public final boolean isInitialized() {\n");
  printer->Indent();

  // Check that all required fields in this message are set.
  // TODO(kenton):  We can optimize this when we switch to putting all the
  //   "has" fields into a single bitfield.
  for (int i = 0; i < descriptor_->field_count(); i++) {
    const FieldDescriptor* field = descriptor_->field(i);
    const FieldGeneratorInfo* info = context_->GetFieldGeneratorInfo(field);

    if (field->is_required()) {
      printer->Print(
        "if (!has$name$()) {\n"
        "  return false;\n"
        "}\n",
        "name", info->capitalized_name);
    }
  }

  // Now check that all embedded messages are initialized.
  for (int i = 0; i < descriptor_->field_count(); i++) {
    const FieldDescriptor* field = descriptor_->field(i);
    const FieldGeneratorInfo* info = context_->GetFieldGeneratorInfo(field);
    if (GetJavaType(field) == JAVATYPE_MESSAGE &&
        HasRequiredFields(field->message_type())) {
      switch (field->label()) {
        case FieldDescriptor::LABEL_REQUIRED:
          printer->Print(
            "if (!get$name$().isInitialized()) {\n"
             "  return false;\n"
             "}\n",
            "type", name_resolver_->GetImmutableClassName(
                field->message_type()),
            "name", info->capitalized_name);
          break;
        case FieldDescriptor::LABEL_OPTIONAL:
          if (!SupportFieldPresence(descriptor_->file()) &&
              field->containing_oneof() != NULL) {
            const OneofDescriptor* oneof = field->containing_oneof();
            const OneofGeneratorInfo* oneof_info =
                context_->GetOneofGeneratorInfo(oneof);
            printer->Print(
              "if ($oneof_name$Case_ == $field_number$) {\n",
              "oneof_name", oneof_info->name,
              "field_number", SimpleItoa(field->number()));
          } else {
            printer->Print(
              "if (has$name$()) {\n",
              "name", info->capitalized_name);
          }
          printer->Print(
            "  if (!get$name$().isInitialized()) {\n"
            "    return false;\n"
            "  }\n"
            "}\n",
            "name", info->capitalized_name);
          break;
        case FieldDescriptor::LABEL_REPEATED:
          if (IsMapEntry(field->message_type())) {
            printer->Print(
              "for ($type$ item : get$name$Map().values()) {\n"
              "  if (!item.isInitialized()) {\n"
              "    return false;\n"
              "  }\n"
              "}\n",
              "type", MapValueImmutableClassdName(field->message_type(),
                                                  name_resolver_),
              "name", info->capitalized_name);
          } else {
            printer->Print(
              "for (int i = 0; i < get$name$Count(); i++) {\n"
              "  if (!get$name$(i).isInitialized()) {\n"
              "    return false;\n"
              "  }\n"
              "}\n",
              "type", name_resolver_->GetImmutableClassName(
                  field->message_type()),
              "name", info->capitalized_name);
          }
          break;
      }
    }
  }

  if (descriptor_->extension_range_count() > 0) {
    printer->Print(
      "if (!extensionsAreInitialized()) {\n"
      "  return false;\n"
      "}\n");
  }

  printer->Outdent();

  printer->Print(
    "  return true;\n"
    "}\n"
    "\n");
}